

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O2

void Map_LibraryPrintTree(Map_SuperLib_t *pLib)

{
  float fVar1;
  Map_Super_t *pMVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  lVar5 = (long)pLib->nVarsMax;
  do {
    if (0x13 < lVar5) {
      return;
    }
    pMVar2 = pLib->ppSupers[lVar5];
    printf("%6d  ",(ulong)(uint)pMVar2->Num);
    uVar3 = 0x2a;
    if ((pMVar2->field_0x4 & 1) == 0) {
      uVar3 = 0x20;
    }
    printf("%c ",uVar3);
    pcVar4 = Mio_GateReadName(pMVar2->pRoot);
    printf("%6s",pcVar4);
    for (uVar7 = 0; uVar7 < (*(uint *)&pMVar2->field_0x4 >> 2 & 7); uVar7 = uVar7 + 1) {
      printf(" %6d",(ulong)(uint)pMVar2->pFanins[uVar7]->Num);
    }
    printf("  %s",pMVar2->pFormula);
    putchar(10);
    Extra_PrintBinary(_stdout,pMVar2->uTruth,0x40);
    printf("  %3d",(ulong)(*(uint *)&pMVar2->field_0x4 >> 5 & 7));
    printf("  %6.2f",(double)pMVar2->Area);
    printf("  (%4.2f, %4.2f)",(double)(pMVar2->tDelayMax).Rise,(double)(pMVar2->tDelayMax).Fall);
    putchar(10);
    pfVar6 = &pMVar2->tDelaysF[0].Fall;
    for (lVar8 = 0; lVar8 < pLib->nVarsMax; lVar8 = lVar8 + 1) {
      fVar1 = pfVar6[-0x12];
      if (0.0 <= pfVar6[-0x13]) {
        dVar9 = (double)pfVar6[-0x13];
        if (fVar1 < 0.0) {
          pcVar4 = " (%4.2f, ----)";
          goto LAB_00369fe3;
        }
        printf(" (%4.2f, %4.2f)",dVar9,(double)fVar1);
      }
      else if (0.0 <= fVar1) {
        dVar9 = (double)fVar1;
        pcVar4 = " (----, %4.2f)";
LAB_00369fe3:
        printf(pcVar4,dVar9);
      }
      else {
        printf(" (----, ----)");
      }
      fVar1 = *pfVar6;
      if (0.0 <= ((Map_Time_t *)(pfVar6 + -1))->Rise) {
        dVar9 = (double)((Map_Time_t *)(pfVar6 + -1))->Rise;
        if (fVar1 < 0.0) {
          pcVar4 = " (%4.2f, ----)";
          goto LAB_0036a03e;
        }
        printf(" (%4.2f, %4.2f)",dVar9,(double)fVar1);
      }
      else if (0.0 <= fVar1) {
        dVar9 = (double)fVar1;
        pcVar4 = " (----, %4.2f)";
LAB_0036a03e:
        printf(pcVar4,dVar9);
      }
      else {
        printf(" (----, ----)");
      }
      putchar(10);
      pfVar6 = pfVar6 + 3;
    }
    putchar(10);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void Map_LibraryPrintTree( Map_SuperLib_t * pLib )
{
    Map_Super_t * pGate;
    int i, k;

    // print all the info related to the supergates
//    for ( i = pLib->nVarsMax; i < (int)pLib->nLines; i++ )
    for ( i = pLib->nVarsMax; i < 20; i++ )
    {
        pGate = pLib->ppSupers[i];

        // write the gate's fanin info and formula
        printf( "%6d  ", pGate->Num );
        printf( "%c ", pGate->fSuper? '*' : ' ' );
        printf( "%6s", Mio_GateReadName(pGate->pRoot) );
        for ( k = 0; k < (int)pGate->nFanins; k++ )
            printf( " %6d", pGate->pFanins[k]->Num );
        printf( "  %s", pGate->pFormula );
        printf( "\n" );

        // write the gate's derived info
        Extra_PrintBinary( stdout, pGate->uTruth, 64 );
        printf( "  %3d",   pGate->nGates );
        printf( "  %6.2f", pGate->Area );
        printf( "  (%4.2f, %4.2f)", pGate->tDelayMax.Rise, pGate->tDelayMax.Fall );
        printf( "\n" );
        for ( k = 0; k < pLib->nVarsMax; k++ )
        {
            // print the constraint on the rise of the gate in the form (D1, D2), 
            // where D1 is the constraint related to the rise of the k-th PI
            // where D2 is the constraint related to the fall of the k-th PI
            if ( pGate->tDelaysR[k].Rise < 0 && pGate->tDelaysR[k].Fall < 0 )
                printf( " (----, ----)" );
            else if ( pGate->tDelaysR[k].Fall < 0 )
                printf( " (%4.2f, ----)", pGate->tDelaysR[k].Rise );
            else if ( pGate->tDelaysR[k].Rise < 0 )
                printf( " (----, %4.2f)", pGate->tDelaysR[k].Fall );
            else
                printf( " (%4.2f, %4.2f)", pGate->tDelaysR[k].Rise, pGate->tDelaysR[k].Fall );

            // print the constraint on the fall of the gate in the form (D1, D2), 
            // where D1 is the constraint related to the rise of the k-th PI
            // where D2 is the constraint related to the fall of the k-th PI
            if ( pGate->tDelaysF[k].Rise < 0 && pGate->tDelaysF[k].Fall < 0 )
                printf( " (----, ----)" );
            else if ( pGate->tDelaysF[k].Fall < 0 )
                printf( " (%4.2f, ----)", pGate->tDelaysF[k].Rise );
            else if ( pGate->tDelaysF[k].Rise < 0 )
                printf( " (----, %4.2f)", pGate->tDelaysF[k].Fall );
            else
                printf( " (%4.2f, %4.2f)", pGate->tDelaysF[k].Rise, pGate->tDelaysF[k].Fall );
            printf( "\n" );
        }
        printf( "\n" );
    }
}